

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

QSize __thiscall
QItemDelegate::sizeHint(QItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  QMetaType QVar3;
  QSize QVar4;
  QSize *lhs;
  QItemDelegatePrivate *this_00;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QRect local_98;
  QRect local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_68._8_8_ = local_68._0_8_;
  local_78._8_8_ = local_78._0_8_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QItemDelegatePrivate **)&(this->super_QAbstractItemDelegate).field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (index->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_58 = (undefined1  [8])0x0;
    puStack_50 = (undefined1 *)0x0;
    local_48 = (undefined1 *)0x0;
    puStack_40 = (undefined1 *)0x2;
  }
  else {
    puVar5 = local_68 + 0x10;
    (**(code **)(*(long *)pQVar1 + 0x90))(puVar5,pQVar1,index,0xd);
    if ((undefined1 *)0x3 < puStack_40) {
      local_78._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QSize>::metaType;
      lhs = (QSize *)local_68;
      local_68._0_8_ = (ulong)puStack_40 & 0xfffffffffffffffc;
      bVar2 = comparesEqual((QMetaType *)lhs,(QMetaType *)local_78);
      if (bVar2) {
        if (((ulong)puStack_40 & 1) == 0) {
          lhs = (QSize *)(local_68 + 0x10);
        }
        else {
          lhs = (QSize *)((long)local_58 + (long)*(int *)((long)local_58 + 4));
        }
      }
      else {
        local_68._0_8_ = 0xffffffffffffffff;
        QVar3.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)puStack_40 & 1) != 0) {
          puVar5 = (undefined1 *)((long)local_58 + (long)*(int *)((long)local_58 + 4));
        }
        QMetaType::convert(QVar3,puVar5,(QMetaType)local_78._0_8_,lhs);
      }
      QVar4 = *lhs;
      goto LAB_00558b36;
    }
  }
  local_68 = (undefined1  [16])rect(this,option,index,1);
  local_78 = (undefined1  [16])rect(this,option,index,10);
  local_88 = QItemDelegatePrivate::displayRect
                       (this_00,index,option,(QRect *)local_68,(QRect *)local_78);
  doLayout((QItemDelegate *)this_00,option,(QRect *)local_78,(QRect *)local_68,&local_88,true);
  local_98 = (QRect)QRect::operator|((QRect *)local_68,&local_88);
  auVar6 = QRect::operator|(&local_98,(QRect *)local_78);
  QVar4.wd.m_i = (auVar6._8_4_ - auVar6._0_4_) + 1;
  QVar4.ht.m_i = (auVar6._12_4_ - auVar6._4_4_) + 1;
LAB_00558b36:
  ::QVariant::~QVariant((QVariant *)(local_68 + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize QItemDelegate::sizeHint(const QStyleOptionViewItem &option,
                              const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    QVariant value = index.data(Qt::SizeHintRole);
    if (value.isValid())
        return qvariant_cast<QSize>(value);
    QRect decorationRect = rect(option, index, Qt::DecorationRole);
    QRect checkRect = rect(option, index, Qt::CheckStateRole);
    QRect displayRect = d->displayRect(index, option, decorationRect, checkRect);

    doLayout(option, &checkRect, &decorationRect, &displayRect, true);

    return (decorationRect|displayRect|checkRect).size();
}